

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshSelectWeights4(word *t,int nVars,int *pW)

{
  uint uVar1;
  uint uVar2;
  int Cost;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int Cost_1;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  bool bVar12;
  
  uVar6 = 1;
  uVar7 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 4) {
    __assert_fail("nVars == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                  ,0xbe,"int Extra_ThreshSelectWeights4(word *, int, int *)");
  }
  pW[3] = 1;
  do {
    pW[2] = uVar6;
    uVar4 = uVar6;
    do {
      pW[1] = uVar4;
      uVar1 = uVar4;
      do {
        *pW = uVar1;
        uVar2 = uVar1;
        do {
          iVar3 = 10000;
          iVar8 = 0;
          bVar12 = true;
          uVar10 = 0;
          do {
            uVar9 = (uint)uVar10;
            if ((t[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
              lVar11 = 0;
              iVar5 = 0;
              do {
                if ((uVar9 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                  iVar5 = iVar5 + pW[lVar11];
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              if (iVar8 <= iVar5) {
                iVar8 = iVar5;
              }
            }
            else {
              lVar11 = 0;
              iVar5 = 0;
              do {
                if ((uVar9 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                  iVar5 = iVar5 + pW[lVar11];
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              if (iVar5 <= iVar3) {
                iVar3 = iVar5;
              }
            }
            if (iVar3 <= iVar8) break;
            uVar9 = uVar9 + 1;
            uVar10 = (ulong)uVar9;
            bVar12 = (int)uVar9 < (int)uVar7;
          } while (uVar9 != uVar7);
          if (!bVar12) {
            if (iVar8 < iVar3) {
              return iVar3;
            }
            __assert_fail("Lmax < Lmin",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                          ,0xd1,"int Extra_ThreshSelectWeights4(word *, int, int *)");
          }
          *pW = uVar2 + 1;
          bVar12 = uVar2 < 4;
          uVar2 = uVar2 + 1;
        } while (bVar12);
        pW[1] = uVar1 + 1;
        bVar12 = uVar1 < 4;
        uVar1 = uVar1 + 1;
      } while (bVar12);
      uVar4 = uVar4 + 1;
      pW[2] = uVar4;
    } while (uVar4 != 5);
    uVar6 = uVar6 + 1;
    pW[3] = uVar6;
    if (uVar6 == 5) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights4(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars);
    assert(nVars == 4);
    for (pW[3] = 1; pW[3] <= nVars; pW[3]++)
        for (pW[2] = pW[3]; pW[2] <= nVars; pW[2]++)
            for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
                for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
                    Lmin = 10000;
                    Lmax = 0;
                    for (m = 0; m < nMints; m++) {
                        if (Abc_TtGetBit(t, m))
                            Lmin = Abc_MinInt(Lmin,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        else
                            Lmax = Abc_MaxInt(Lmax,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        if (Lmax >= Lmin)
                            break;
                    }
                    if (m < nMints)
                        continue;
                    assert(Lmax < Lmin);
                    return Lmin;
                }
    return 0;
}